

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O0

string * __thiscall OpenMD::Stats::getUnits_abi_cxx11_(Stats *this,int index)

{
  reference pvVar1;
  int in_EDX;
  long in_RSI;
  string *in_RDI;
  
  pvVar1 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
           operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_> *
                      )(in_RSI + 0x18),(long)in_EDX);
  std::__cxx11::string::string((string *)in_RDI,(string *)&pvVar1->units);
  return in_RDI;
}

Assistant:

std::string Stats::getUnits(int index) {
    assert(index >= 0 && index < ENDINDEX);
    return data_[index].units;
  }